

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

file_format_t __thiscall
cfgfile::details::determine_format_t<cfgfile::qstring_trait_t>::format
          (determine_format_t<cfgfile::qstring_trait_t> *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong in_RAX;
  char_t ch;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if ((format()::xml == '\0') && (iVar3 = __cxa_guard_acquire(&format()::xml), iVar3 != 0)) {
    format::xml.ucs = L'<';
    __cxa_guard_release(&format()::xml);
  }
  uStack_18 = uStack_18 & 0xffffffffffff;
  do {
    cVar1 = QTextStream::atEnd();
    if (cVar1 != '\0') {
      return cfgfile_format;
    }
    QTextStream::operator>>(this->m_stream,(QChar *)((long)&uStack_18 + 6));
    bVar2 = qstring_trait_t::is_space(uStack_18._6_2_);
  } while (bVar2);
  return (uint)(uStack_18._6_2_ == format::xml.ucs);
}

Assistant:

file_format_t format()
	{
		static const typename Trait::char_t xml = Trait::from_ascii( '<' );

		typename Trait::char_t ch( 0x00 );

		while( !Trait::is_at_end( m_stream ) )
		{
			m_stream >> ch;

			if( Trait::is_space( ch ) )
				continue;

			if( ch == xml )
				return file_format_t::xml_format;
			else
				return file_format_t::cfgfile_format;
		}

		return file_format_t::cfgfile_format;
	}